

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O1

void __thiscall
llm_tokenizer_bpe_session::add_new_bigram(llm_tokenizer_bpe_session *this,int left,int right)

{
  pointer plVar1;
  char *pcVar2;
  int iVar3;
  string left_token;
  string right_token;
  llm_bigram_bpe bigram;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  int local_40;
  size_t local_38;
  
  if (right != -1 && left != -1) {
    plVar1 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = plVar1[left].text;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,pcVar2,pcVar2 + plVar1[left].n);
    plVar1 = (this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = plVar1[right].text;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,pcVar2,pcVar2 + plVar1[right].n);
    iVar3 = llama_vocab::find_bpe_rank(this->vocab,&local_c8,&local_a8);
    if (-1 < iVar3) {
      local_58 = 0;
      local_50._M_local_buf[0] = '\0';
      local_68._0_4_ = left;
      local_68._4_4_ = right;
      local_60._M_p = (pointer)&local_50;
      std::operator+(&local_88,&local_c8,&local_a8);
      std::__cxx11::string::operator=((string *)&local_60,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      local_38 = local_a8._M_string_length + local_c8._M_string_length;
      local_40 = iVar3;
      llama_vocab::std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>::push_back
                ((vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_> *)&this->work_queue,
                 (value_type *)local_68);
      std::
      push_heap<__gnu_cxx::__normal_iterator<llm_bigram_bpe*,std::vector<llm_bigram_bpe,std::allocator<llm_bigram_bpe>>>,llm_bigram_bpe::comparator>
                ((this->work_queue).
                 super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                 .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (this->work_queue).
                 super_priority_queue<llm_bigram_bpe,_std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>,_llm_bigram_bpe::comparator>
                 .c.super__Vector_base<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_p != &local_50) {
        operator_delete(local_60._M_p,
                        CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]) + 1)
        ;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void add_new_bigram(int left, int right) {
        if (left == -1 || right == -1) {
            return;
        }
        std::string left_token  = std::string(symbols[left].text,  symbols[left].n);
        std::string right_token = std::string(symbols[right].text, symbols[right].n);

        int rank_found = -1;

        rank_found = vocab.find_bpe_rank(left_token, right_token);

        if (rank_found < 0) {
            return;
        }

        llm_bigram_bpe bigram;

        bigram.left  = left;
        bigram.right = right;
        bigram.text  = left_token + right_token;
        bigram.size  = left_token.size() + right_token.size();
        bigram.rank  = rank_found;

        work_queue.push(bigram);
    }